

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exper.c
# Opt level: O3

void pluslvl(boolean incr)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  schar sVar4;
  short sVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  short sVar9;
  ulong uVar10;
  xchar *pxVar11;
  xchar *pxVar12;
  long lVar13;
  xchar *pxVar14;
  xchar *pxVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  
  if (incr == '\0') {
    pline("You feel more experienced.");
  }
  iVar6 = newhp();
  uVar16._0_4_ = iVar6 + u.uhp;
  uVar16._4_4_ = iVar6 + u.uhpmax;
  u._1216_8_ = uVar16;
  if (u.umonnum != u.umonster) {
    uVar7 = mt_random();
    iVar6 = (uVar7 & 7) + 1;
    uVar17._0_4_ = iVar6 + u.mh;
    uVar17._4_4_ = iVar6 + u.mhmax;
    u._1016_8_ = uVar17;
  }
  iVar6 = (int)urole.xlev;
  pxVar14 = &urace.enadv.hifix;
  if (u.ulevel < iVar6) {
    pxVar14 = &urace.enadv.lofix;
  }
  pxVar15 = &urole.enadv.hifix;
  if (u.ulevel < iVar6) {
    pxVar15 = &urole.enadv.lofix;
  }
  pxVar12 = &urace.enadv.hirnd;
  if (u.ulevel < iVar6) {
    pxVar12 = &urace.enadv.lornd;
  }
  pxVar11 = &urole.enadv.hirnd;
  if (u.ulevel < iVar6) {
    pxVar11 = &urole.enadv.lornd;
  }
  sVar4 = acurr(2);
  cVar1 = *pxVar11;
  cVar2 = *pxVar12;
  uVar7 = mt_random();
  iVar6 = (int)*pxVar14 + (int)*pxVar15 +
          SUB164(ZEXT416(uVar7) % SEXT816((long)cVar2 + (long)cVar1 + (long)(sVar4 / '\x02')),0);
  uVar7 = (ushort)urole.malenum - 0x15a;
  if (uVar7 < 0xf) {
    if ((0x30U >> (uVar7 & 0x1f) & 1) == 0) {
      if ((0x2001U >> (uVar7 & 0x1f) & 1) == 0) {
        if ((0x4080U >> (uVar7 & 0x1f) & 1) != 0) {
          iVar6 = iVar6 * 2;
        }
      }
      else {
        sVar9 = (short)iVar6 * 3;
        sVar5 = (short)iVar6 * 3 + 3;
        if (-1 < sVar9) {
          sVar5 = sVar9;
        }
        iVar6 = (int)sVar5 >> 2;
      }
    }
    else {
      iVar6 = (int)(short)((short)((iVar6 * 3 & 0xffffU) >> 0xf) + (short)(iVar6 * 3)) >> 1;
    }
  }
  uVar18._0_4_ = iVar6 + u.uen;
  uVar18._4_4_ = iVar6 + u.uenmax;
  if (0x1d < u.ulevel) {
    iflags.botl = '\x01';
    u.uen = (int)uVar18;
    u.uenmax = uVar18._4_4_;
    return;
  }
  if (incr == '\0') {
    if (u.ulevel < 10) {
      lVar13 = 10;
      iVar6 = u.ulevel;
LAB_0019b530:
      u.uexp = (int)(lVar13 << ((byte)iVar6 & 0x3f));
    }
    else {
      if ((uint)u.ulevel < 0x14) {
        iVar6 = u.ulevel + -10;
        lVar13 = 10000;
        goto LAB_0019b530;
      }
      u.uexp = (u.ulevel + -0x13) * 10000000;
    }
    uVar10 = (ulong)(u.ulevel + 1);
    goto LAB_0019b56a;
  }
  uVar7 = u.ulevel + 1;
  uVar10 = (ulong)uVar7;
  if (u.ulevel < 9) {
    lVar13 = 10;
    bVar8 = (byte)uVar7;
LAB_0019b51e:
    lVar13 = lVar13 << (bVar8 & 0x3f);
  }
  else {
    if (uVar7 < 0x14) {
      bVar8 = (char)u.ulevel - 9;
      lVar13 = 10000;
      goto LAB_0019b51e;
    }
    lVar13 = (ulong)(u.ulevel - 0x12) * 10000000;
  }
  if (lVar13 <= u.uexp) {
    u.uexp = (int)lVar13 + -1;
  }
LAB_0019b56a:
  iVar6 = (int)uVar10;
  bVar3 = u.ulevelmax <= u.ulevel;
  u.ulevel = iVar6;
  u._1224_8_ = uVar18;
  if (bVar3) {
    u.ulevelmax = iVar6;
    historic_event('\0',"advanced to experience level %d.");
    uVar10 = (ulong)(uint)u.ulevel;
  }
  pline("Welcome to experience level %d.",uVar10);
  adjabil(u.ulevel + -1,u.ulevel);
  reset_rndmonst(-1);
  iflags.botl = '\x01';
  return;
}

Assistant:

void pluslvl(boolean incr)
{
	int num;

	if (!incr) pline("You feel more experienced.");
	num = newhp();
	u.uhpmax += num;
	u.uhp += num;
	if (Upolyd) {
	    num = rnd(8);
	    u.mhmax += num;
	    u.mh += num;
	}
	if (u.ulevel < urole.xlev)
	    num = rn1((int)ACURR(A_WIS)/2 + urole.enadv.lornd + urace.enadv.lornd,
			urole.enadv.lofix + urace.enadv.lofix);
	else
	    num = rn1((int)ACURR(A_WIS)/2 + urole.enadv.hirnd + urace.enadv.hirnd,
			urole.enadv.hifix + urace.enadv.hifix);
	num = enermod(num);	/* M. Stephenson */
	u.uenmax += num;
	u.uen += num;
	if (u.ulevel < MAXULEV) {
	    if (incr) {
		long tmp = newuexp(u.ulevel + 1);
		if (u.uexp >= tmp) u.uexp = tmp - 1;
	    } else {
		u.uexp = newuexp(u.ulevel);
	    }
	    ++u.ulevel;
	    if (u.ulevelmax < u.ulevel) {
		u.ulevelmax = u.ulevel;
		historic_event(FALSE, "advanced to experience level %d.", u.ulevel);
	    }
	    pline("Welcome to experience level %d.", u.ulevel);
	    adjabil(u.ulevel - 1, u.ulevel);	/* give new intrinsics */
	    reset_rndmonst(NON_PM);		/* new monster selection */
	}
	iflags.botl = 1;
}